

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printPolicyPureVector.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  ostream *poVar2;
  MADPParser parser;
  PlanningUnitMADPDiscreteParameters params;
  string dpomdpFile;
  PolicyPureVector p;
  NullPlanner np;
  Interface_ProblemToPolicyDiscretePure local_560 [784];
  DecPOMDPDiscrete decpomdp;
  
  if (argc != 4) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Use as follows: printPolicyPureVector ");
    poVar2 = std::operator<<(poVar2,"<problem> <horizon> <index>");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&np,argv[1],(allocator<char> *)&decpomdp);
    directories::MADPGetProblemFilename((string *)&dpomdpFile);
    std::__cxx11::string::~string((string *)&np);
    lVar1 = strtol(argv[2],(char **)0x0,10);
    strtoull(argv[3],(char **)0x0,10);
    std::__cxx11::string::string<std::allocator<char>>((string *)&np,"",(allocator<char> *)&params);
    std::__cxx11::string::string<std::allocator<char>>((string *)&p,"",(allocator<char> *)&parser);
    DecPOMDPDiscrete::DecPOMDPDiscrete(&decpomdp,(string *)&np,(string *)&p,(string *)&dpomdpFile);
    std::__cxx11::string::~string((string *)&p);
    std::__cxx11::string::~string((string *)&np);
    MADPParser::Parse((DecPOMDPDiscrete *)&parser);
    PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(&params);
    PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(&params,0));
    NullPlanner::NullPlanner
              (&np,(long)(int)lVar1,
               (DecPOMDPDiscreteInterface *)(&decpomdp + *(long *)(_decpomdp + -0x50)),&params);
    PolicyPureVector::PolicyPureVector(&p,local_560,0,TYPE_INDEX,999999);
    PolicyPureVector::SetIndex((ulonglong)&p);
    Policy::Print((Policy *)&p);
    PolicyPureVector::~PolicyPureVector(&p);
    PlanningUnitMADPDiscrete::~PlanningUnitMADPDiscrete((PlanningUnitMADPDiscrete *)&np);
    PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(&params);
    DecPOMDPDiscrete::~DecPOMDPDiscrete(&decpomdp);
    std::__cxx11::string::~string((string *)&dpomdpFile);
  }
  return (uint)(argc != 4);
}

Assistant:

int main(int argc, char **argv)
{
    if(argc!=4)
    {
        cout << "Use as follows: printPolicyPureVector "
             << "<problem> <horizon> <index>" << endl;
        return(1);
    }

    // parse arguments
    string dpomdpFile=directories::MADPGetProblemFilename(argv[1]);
    int h=strtol(argv[2],0,10);
#if USE_ARBITRARY_PRECISION_INDEX
    LIndex index=*argv[3];
#else
    LIndex index=strtoull(argv[3],0,10);
#endif
    try {

    DecPOMDPDiscrete decpomdp("","",dpomdpFile);
    MADPParser parser(&decpomdp);
    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(true);
    params.SetComputeJointBeliefs(false);
    NullPlanner np(h, &decpomdp, &params);
    PolicyPureVector p(&np,0, PolicyGlobals::TYPE_INDEX);
    p.SetIndex(index);

    p.Print();

    }
    catch(E& e){ e.Print(); }

    return(0);
}